

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterSystem.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::~UnderwaterAcousticEmitterSystem
          (UnderwaterAcousticEmitterSystem *this)

{
  pointer pUVar1;
  pointer pUVar2;
  pointer pUVar3;
  
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__UnderwaterAcousticEmitterSystem_00226bf8;
  pUVar1 = (this->m_vUAEB).
           super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar2 = (this->m_vUAEB).
           super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pUVar3 = pUVar1;
  if (pUVar2 != pUVar1) {
    do {
      (**(pUVar3->super_DataTypeBase)._vptr_DataTypeBase)(pUVar3);
      pUVar3 = pUVar3 + 1;
    } while (pUVar3 != pUVar2);
    (this->m_vUAEB).
    super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
    ._M_impl.super__Vector_impl_data._M_finish = pUVar1;
  }
  std::
  vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
  ::~vector(&this->m_vUAEB);
  DataTypeBase::~DataTypeBase(&(this->m_Location).super_DataTypeBase);
  AcousticEmitterSystem::~AcousticEmitterSystem(&this->m_AES);
  DataTypeBase::~DataTypeBase(&this->super_DataTypeBase);
  return;
}

Assistant:

UnderwaterAcousticEmitterSystem::~UnderwaterAcousticEmitterSystem()
{
    m_vUAEB.clear();
}